

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilayer_metadata.cc
# Opt level: O0

string * libaom_examples::(anonymous_namespace)::format_depth_representation_element_abi_cxx11_
                   (pair<libaom_examples::DepthRepresentationElement,_bool> *element)

{
  long in_RSI;
  string *in_RDI;
  char *in_stack_fffffffffffffe20;
  allocator *paVar1;
  string *psVar2;
  string local_1c8 [20];
  uint in_stack_fffffffffffffe4c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe6c;
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [55];
  allocator local_11 [17];
  
  if ((*(byte *)(in_RSI + 8) & 1) == 0) {
    paVar1 = local_11;
    psVar2 = in_RDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)psVar2,"absent",paVar1);
    std::allocator<char>::~allocator((allocator<char> *)local_11);
  }
  else {
    psVar2 = in_RDI;
    depth_representation_element_to_double((DepthRepresentationElement *)in_RDI);
    std::__cxx11::to_string((double)psVar2);
    std::operator+(psVar2,in_stack_fffffffffffffe20);
    std::__cxx11::to_string(in_stack_fffffffffffffe6c);
    std::operator+(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    std::operator+(psVar2,in_stack_fffffffffffffe20);
    std::__cxx11::to_string(in_stack_fffffffffffffe6c);
    std::operator+(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    std::operator+(psVar2,in_stack_fffffffffffffe20);
    std::__cxx11::to_string(in_stack_fffffffffffffe4c);
    std::operator+(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    std::operator+(psVar2,in_stack_fffffffffffffe20);
    std::__cxx11::to_string(in_stack_fffffffffffffe6c);
    std::operator+(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    std::operator+(psVar2,in_stack_fffffffffffffe20);
    std::__cxx11::string::~string(local_48);
    std::__cxx11::string::~string(local_1c8);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe58);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string(local_c8);
    std::__cxx11::string::~string(local_188);
    std::__cxx11::string::~string(local_e8);
    std::__cxx11::string::~string(local_108);
    std::__cxx11::string::~string(local_168);
    std::__cxx11::string::~string(local_128);
    std::__cxx11::string::~string(local_148);
  }
  return in_RDI;
}

Assistant:

std::string format_depth_representation_element(
    const std::pair<DepthRepresentationElement, bool> &element) {
  if (!element.second) {
    return "absent";
  } else {
    return std::to_string(
               depth_representation_element_to_double(element.first)) +
           " (sign " + std::to_string(element.first.sign_flag) + " exponent " +
           std::to_string(element.first.exponent) + " mantissa " +
           std::to_string(element.first.mantissa) + " mantissa_len " +
           std::to_string(element.first.mantissa_len) + ")";
  }
}